

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_multipivot.cpp
# Opt level: O1

void multikey_multipivot<unsigned_char,16u>(uchar **strings,size_t n,size_t depth)

{
  _Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
  *p_Var1;
  _Rb_tree_header *__position;
  uchar *puVar2;
  unsigned_long uVar3;
  size_t n_00;
  size_t n_01;
  allocator_type aVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  byte bVar34;
  byte bVar35;
  char cVar36;
  size_t i_2;
  void *__src;
  uint j;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  uchar **ppuVar42;
  undefined1 *puVar43;
  _Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
  _Var44;
  _Alloc_node *__memptr;
  _Alloc_node __ptr;
  int iVar45;
  allocator_type *paVar46;
  _Alloc_node _Var47;
  bool bVar48;
  undefined4 uVar49;
  double dVar50;
  undefined1 auVar51 [16];
  allocator_type aVar52;
  byte bVar53;
  byte bVar54;
  byte bVar55;
  byte bVar56;
  byte bVar57;
  byte bVar58;
  byte bVar59;
  byte bVar60;
  byte bVar61;
  byte bVar62;
  byte bVar63;
  byte bVar64;
  byte bVar65;
  byte bVar66;
  byte bVar67;
  byte bVar68;
  byte bVar69;
  byte bVar70;
  byte bVar71;
  byte bVar72;
  byte bVar73;
  byte bVar74;
  byte bVar75;
  byte bVar76;
  byte bVar77;
  byte bVar78;
  byte bVar79;
  byte bVar80;
  byte bVar81;
  byte bVar82;
  byte bVar83;
  byte bVar84;
  byte bVar85;
  byte bVar86;
  byte bVar87;
  byte bVar88;
  byte bVar89;
  byte bVar90;
  byte bVar91;
  byte bVar92;
  byte bVar93;
  byte bVar94;
  byte bVar95;
  byte bVar96;
  byte bVar97;
  byte bVar98;
  byte bVar99;
  allocator_type aVar100;
  byte bVar101;
  byte bVar102;
  byte bVar103;
  byte bVar104;
  byte bVar105;
  byte bVar106;
  byte bVar107;
  byte bVar108;
  byte bVar109;
  byte bVar110;
  byte bVar111;
  byte bVar112;
  byte bVar113;
  byte bVar114;
  byte bVar115;
  array<unsigned_char,_16UL> pivots;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sample_array;
  set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> sample;
  array<unsigned_long,_33UL> bucketsize;
  byte local_1b8 [16];
  ulong local_1a8;
  void *local_1a0;
  long local_198;
  _Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
  local_188;
  double local_158;
  double dStack_150;
  byte local_148 [16];
  _Alloc_node local_138;
  byte abStack_130 [4];
  undefined4 uStack_12c;
  allocator_type local_128;
  byte abStack_127 [231];
  size_t local_40;
  size_t local_38;
  
  if (n < 15000) {
    mkqsort(strings,(int)n,(int)depth);
    return;
  }
  __position = &local_188._M_impl.super__Rb_tree_header;
  local_188._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  iVar45 = 0;
  local_188._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_188._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar38 = n - 7;
  auVar51._8_4_ = (int)((ulong)lVar38 >> 0x20);
  auVar51._0_8_ = lVar38;
  auVar51._12_4_ = 0x45300000;
  dStack_150 = auVar51._8_8_ - 1.9342813113834067e+25;
  local_158 = dStack_150 + ((double)CONCAT44(0x43300000,(int)lVar38) - 4503599627370496.0);
  local_1a8 = n;
  local_188._M_impl.super__Rb_tree_header._M_header._M_left = &__position->_M_header;
  local_188._M_impl.super__Rb_tree_header._M_header._M_right = &__position->_M_header;
  do {
    dVar50 = drand48();
    uVar37 = (ulong)(dVar50 * local_158);
    uVar37 = (long)(dVar50 * local_158 - 9.223372036854776e+18) & (long)uVar37 >> 0x3f | uVar37;
    if (local_1a8 <= uVar37 + 6) {
      __assert_fail("pos+6 < n",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_multipivot.cpp"
                    ,0x180,
                    "void multikey_multipivot(unsigned char **, size_t, size_t) [CharT = unsigned char, Pivots = 16U]"
                   );
    }
    lVar38 = 0;
    do {
      if (strings[uVar37 + lVar38] == (uchar *)0x0) goto LAB_00222282;
      *(uchar *)((long)&local_1a0 + lVar38) = strings[uVar37 + lVar38][depth];
      lVar38 = lVar38 + 1;
    } while (lVar38 != 7);
    lVar38 = 0;
    local_138._M_t = &local_188;
    do {
      std::
      _Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
      ::
      _M_insert_unique_<unsigned_char&,std::_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>::_Alloc_node>
                ((_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                  *)&local_188,(const_iterator)__position,(uchar *)((long)&local_1a0 + lVar38),
                 &local_138);
      uVar37 = local_1a8;
      lVar38 = lVar38 + 1;
    } while (lVar38 != 7);
    iVar45 = iVar45 + 1;
  } while (iVar45 != 0x10);
  local_138._M_t._0_1_ = (allocator_type)0x1;
  if (local_188._M_impl.super__Rb_tree_header._M_node_count < 0x10) {
    cVar36 = '\x01';
    do {
      if (cVar36 == '\0') {
        local_138._M_t._0_1_ = (allocator_type)0x1;
      }
      std::
      _Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
      ::_M_insert_unique<unsigned_char_const&>
                ((_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                  *)&local_188,(uchar *)&local_138);
      cVar36 = (char)local_138._M_t._0_1_ + '\x01';
      local_138._M_t._0_1_ = (allocator_type)cVar36;
    } while (local_188._M_impl.super__Rb_tree_header._M_node_count < 0x10);
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<std::_Rb_tree_const_iterator<unsigned_char>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_1a0,
             (_Rb_tree_const_iterator<unsigned_char>)
             local_188._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<unsigned_char>)__position,(allocator_type *)&local_138);
  std::
  _Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
  ::clear(&local_188);
  uVar39 = (ulong)(local_198 - (long)local_1a0) >> 4;
  if ((int)uVar39 == 0) {
    __assert_fail("step > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_multipivot.cpp"
                  ,0x191,
                  "void multikey_multipivot(unsigned char **, size_t, size_t) [CharT = unsigned char, Pivots = 16U]"
                 );
  }
  uVar41 = 0;
  lVar38 = 0;
  do {
    local_1b8[lVar38] = *(byte *)((long)local_1a0 + (uVar41 & 0xffffffff));
    lVar38 = lVar38 + 1;
    uVar41 = uVar41 + uVar39;
  } while (lVar38 != 0x10);
  __memptr = &local_138;
  iVar45 = posix_memalign(&__memptr->_M_t,0x10,uVar37);
  _Var47._M_t = local_138._M_t;
  lVar38 = 0;
  do {
    auVar51 = ZEXT216(CONCAT11(local_1b8[lVar38] + 0x80,local_1b8[lVar38] + 0x80));
    auVar51 = pshuflw(auVar51,auVar51,0);
    uVar49 = auVar51._0_4_;
    *(undefined4 *)&__memptr->_M_t = uVar49;
    *(undefined4 *)((long)&__memptr->_M_t + 4) = uVar49;
    *(undefined4 *)&__memptr[1]._M_t = uVar49;
    *(undefined4 *)((long)&__memptr[1]._M_t + 4) = uVar49;
    lVar38 = lVar38 + 1;
    __memptr = __memptr + 2;
  } while (lVar38 != 0x10);
  __ptr._M_t = (_Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
                *)(_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                   *)0x0;
  if (iVar45 == 0) {
    __ptr._M_t = _Var47._M_t;
  }
  uVar39 = uVar37 & 0xfffffffffffffff0;
  if (uVar39 != 0) {
    uVar41 = 0;
    ppuVar42 = strings;
    do {
      lVar38 = 0;
      do {
        if (ppuVar42[lVar38] == (uchar *)0x0) goto LAB_00222282;
        local_148[lVar38] = ppuVar42[lVar38][depth];
        lVar38 = lVar38 + 1;
      } while (lVar38 != 0x10);
      aVar52 = (allocator_type)(local_148[0] ^ 0x80);
      bVar53 = local_148[1] ^ 0x80;
      bVar54 = local_148[2] ^ 0x80;
      bVar55 = local_148[3] ^ 0x80;
      bVar56 = local_148[4] ^ 0x80;
      bVar57 = local_148[5] ^ 0x80;
      bVar58 = local_148[6] ^ 0x80;
      bVar59 = local_148[7] ^ 0x80;
      bVar60 = local_148[8] ^ 0x80;
      bVar61 = local_148[9] ^ 0x80;
      bVar62 = local_148[10] ^ 0x80;
      bVar63 = local_148[0xb] ^ 0x80;
      bVar64 = local_148[0xc] ^ 0x80;
      bVar65 = local_148[0xd] ^ 0x80;
      bVar66 = local_148[0xe] ^ 0x80;
      bVar67 = local_148[0xf] ^ 0x80;
      bVar68 = 0;
      bVar69 = 0;
      bVar70 = 0;
      bVar71 = 0;
      bVar72 = 0;
      bVar73 = 0;
      bVar74 = 0;
      bVar75 = 0;
      bVar76 = 0;
      bVar77 = 0;
      bVar78 = 0;
      bVar79 = 0;
      bVar80 = 0;
      bVar81 = 0;
      bVar82 = 0;
      bVar83 = 0;
      lVar38 = 0x10;
      aVar100 = local_138._M_t._0_1_;
      bVar101 = local_138._M_t._1_1_;
      bVar102 = local_138._M_t._2_1_;
      bVar103 = local_138._M_t._3_1_;
      bVar104 = local_138._M_t._4_1_;
      bVar105 = local_138._M_t._5_1_;
      bVar106 = local_138._M_t._6_1_;
      bVar107 = local_138._M_t._7_1_;
      bVar108 = abStack_130[0];
      bVar109 = abStack_130[1];
      bVar110 = abStack_130[2];
      bVar111 = abStack_130[3];
      bVar112 = (byte)uStack_12c;
      bVar113 = uStack_12c._1_1_;
      bVar114 = uStack_12c._2_1_;
      bVar115 = uStack_12c._3_1_;
      bVar20 = 1;
      bVar21 = 1;
      bVar22 = 1;
      bVar23 = 1;
      bVar24 = 1;
      bVar25 = 1;
      bVar26 = 1;
      bVar27 = 1;
      bVar28 = 1;
      bVar29 = 1;
      bVar30 = 1;
      bVar31 = 1;
      bVar32 = 1;
      bVar33 = 1;
      bVar34 = 1;
      bVar35 = 1;
      do {
        bVar99 = bVar35;
        bVar98 = bVar34;
        bVar97 = bVar33;
        bVar96 = bVar32;
        bVar95 = bVar31;
        bVar94 = bVar30;
        bVar93 = bVar29;
        bVar92 = bVar28;
        bVar91 = bVar27;
        bVar90 = bVar26;
        bVar89 = bVar25;
        bVar88 = bVar24;
        bVar87 = bVar23;
        bVar86 = bVar22;
        bVar85 = bVar21;
        bVar84 = bVar20;
        aVar4 = *(allocator_type *)((long)&local_138._M_t + lVar38);
        bVar5 = *(byte *)((long)&local_138._M_t + lVar38 + 1);
        bVar6 = *(byte *)((long)&local_138._M_t + lVar38 + 2);
        bVar7 = *(byte *)((long)&local_138._M_t + lVar38 + 3);
        bVar8 = *(byte *)((long)&local_138._M_t + lVar38 + 4);
        bVar9 = *(byte *)((long)&local_138._M_t + lVar38 + 5);
        bVar10 = *(byte *)((long)&local_138._M_t + lVar38 + 6);
        bVar11 = *(byte *)((long)&local_138._M_t + lVar38 + 7);
        bVar12 = abStack_130[lVar38];
        bVar13 = abStack_130[lVar38 + 1];
        bVar14 = abStack_130[lVar38 + 2];
        bVar15 = abStack_130[lVar38 + 3];
        bVar16 = abStack_130[lVar38 + 4];
        bVar17 = abStack_130[lVar38 + 5];
        bVar18 = abStack_130[lVar38 + 6];
        bVar19 = abStack_130[lVar38 + 7];
        bVar68 = -((char)aVar52 < (char)aVar4) & -((char)aVar100 < (char)aVar52) & bVar84 + 1 |
                 -(aVar52 == aVar100) & bVar84 | bVar68;
        bVar69 = -((char)bVar53 < (char)bVar5) & -((char)bVar101 < (char)bVar53) & bVar85 + 1 |
                 -(bVar53 == bVar101) & bVar85 | bVar69;
        bVar70 = -((char)bVar54 < (char)bVar6) & -((char)bVar102 < (char)bVar54) & bVar86 + 1 |
                 -(bVar54 == bVar102) & bVar86 | bVar70;
        bVar71 = -((char)bVar55 < (char)bVar7) & -((char)bVar103 < (char)bVar55) & bVar87 + 1 |
                 -(bVar55 == bVar103) & bVar87 | bVar71;
        bVar72 = -((char)bVar56 < (char)bVar8) & -((char)bVar104 < (char)bVar56) & bVar88 + 1 |
                 -(bVar56 == bVar104) & bVar88 | bVar72;
        bVar73 = -((char)bVar57 < (char)bVar9) & -((char)bVar105 < (char)bVar57) & bVar89 + 1 |
                 -(bVar57 == bVar105) & bVar89 | bVar73;
        bVar74 = -((char)bVar58 < (char)bVar10) & -((char)bVar106 < (char)bVar58) & bVar90 + 1 |
                 -(bVar58 == bVar106) & bVar90 | bVar74;
        bVar75 = -((char)bVar59 < (char)bVar11) & -((char)bVar107 < (char)bVar59) & bVar91 + 1 |
                 -(bVar59 == bVar107) & bVar91 | bVar75;
        bVar76 = -((char)bVar60 < (char)bVar12) & -((char)bVar108 < (char)bVar60) & bVar92 + 1 |
                 -(bVar60 == bVar108) & bVar92 | bVar76;
        bVar77 = -((char)bVar61 < (char)bVar13) & -((char)bVar109 < (char)bVar61) & bVar93 + 1 |
                 -(bVar61 == bVar109) & bVar93 | bVar77;
        bVar78 = -((char)bVar62 < (char)bVar14) & -((char)bVar110 < (char)bVar62) & bVar94 + 1 |
                 -(bVar62 == bVar110) & bVar94 | bVar78;
        bVar79 = -((char)bVar63 < (char)bVar15) & -((char)bVar111 < (char)bVar63) & bVar95 + 1 |
                 -(bVar63 == bVar111) & bVar95 | bVar79;
        bVar80 = -((char)bVar64 < (char)bVar16) & -((char)bVar112 < (char)bVar64) & bVar96 + 1 |
                 -(bVar64 == bVar112) & bVar96 | bVar80;
        bVar81 = -((char)bVar65 < (char)bVar17) & -((char)bVar113 < (char)bVar65) & bVar97 + 1 |
                 -(bVar65 == bVar113) & bVar97 | bVar81;
        bVar82 = -((char)bVar66 < (char)bVar18) & -((char)bVar114 < (char)bVar66) & bVar98 + 1 |
                 -(bVar66 == bVar114) & bVar98 | bVar82;
        bVar83 = -((char)bVar67 < (char)bVar19) & -((char)bVar115 < (char)bVar67) & bVar99 + 1 |
                 -(bVar67 == bVar115) & bVar99 | bVar83;
        lVar38 = lVar38 + 0x10;
        aVar100 = aVar4;
        bVar101 = bVar5;
        bVar102 = bVar6;
        bVar103 = bVar7;
        bVar104 = bVar8;
        bVar105 = bVar9;
        bVar106 = bVar10;
        bVar107 = bVar11;
        bVar108 = bVar12;
        bVar109 = bVar13;
        bVar110 = bVar14;
        bVar111 = bVar15;
        bVar112 = bVar16;
        bVar113 = bVar17;
        bVar114 = bVar18;
        bVar115 = bVar19;
        bVar20 = bVar84 + 2;
        bVar21 = bVar85 + 2;
        bVar22 = bVar86 + 2;
        bVar23 = bVar87 + 2;
        bVar24 = bVar88 + 2;
        bVar25 = bVar89 + 2;
        bVar26 = bVar90 + 2;
        bVar27 = bVar91 + 2;
        bVar28 = bVar92 + 2;
        bVar29 = bVar93 + 2;
        bVar30 = bVar94 + 2;
        bVar31 = bVar95 + 2;
        bVar32 = bVar96 + 2;
        bVar33 = bVar97 + 2;
        bVar34 = bVar98 + 2;
        bVar35 = bVar99 + 2;
      } while (lVar38 != 0x100);
      p_Var1 = (_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                *)((long)__ptr._M_t + uVar41);
      *p_Var1 = (_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                 )(bVar68 | -((char)aVar4 < (char)aVar52) & bVar84 + 3 |
                            -(aVar52 == aVar4) & bVar84 + 2);
      p_Var1[1] = (_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                   )(bVar69 | -((char)bVar5 < (char)bVar53) & bVar85 + 3 |
                              -(bVar53 == bVar5) & bVar85 + 2);
      p_Var1[2] = (_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                   )(bVar70 | -((char)bVar6 < (char)bVar54) & bVar86 + 3 |
                              -(bVar54 == bVar6) & bVar86 + 2);
      p_Var1[3] = (_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                   )(bVar71 | -((char)bVar7 < (char)bVar55) & bVar87 + 3 |
                              -(bVar55 == bVar7) & bVar87 + 2);
      p_Var1[4] = (_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                   )(bVar72 | -((char)bVar8 < (char)bVar56) & bVar88 + 3 |
                              -(bVar56 == bVar8) & bVar88 + 2);
      p_Var1[5] = (_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                   )(bVar73 | -((char)bVar9 < (char)bVar57) & bVar89 + 3 |
                              -(bVar57 == bVar9) & bVar89 + 2);
      p_Var1[6] = (_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                   )(bVar74 | -((char)bVar10 < (char)bVar58) & bVar90 + 3 |
                              -(bVar58 == bVar10) & bVar90 + 2);
      p_Var1[7] = (_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                   )(bVar75 | -((char)bVar11 < (char)bVar59) & bVar91 + 3 |
                              -(bVar59 == bVar11) & bVar91 + 2);
      p_Var1[8] = (_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                   )(bVar76 | -((char)bVar12 < (char)bVar60) & bVar92 + 3 |
                              -(bVar60 == bVar12) & bVar92 + 2);
      p_Var1[9] = (_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                   )(bVar77 | -((char)bVar13 < (char)bVar61) & bVar93 + 3 |
                              -(bVar61 == bVar13) & bVar93 + 2);
      p_Var1[10] = (_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                    )(bVar78 | -((char)bVar14 < (char)bVar62) & bVar94 + 3 |
                               -(bVar62 == bVar14) & bVar94 + 2);
      p_Var1[0xb] = (_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                     )(bVar79 | -((char)bVar15 < (char)bVar63) & bVar95 + 3 |
                                -(bVar63 == bVar15) & bVar95 + 2);
      p_Var1[0xc] = (_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                     )(bVar80 | -((char)bVar16 < (char)bVar64) & bVar96 + 3 |
                                -(bVar64 == bVar16) & bVar96 + 2);
      p_Var1[0xd] = (_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                     )(bVar81 | -((char)bVar17 < (char)bVar65) & bVar97 + 3 |
                                -(bVar65 == bVar17) & bVar97 + 2);
      p_Var1[0xe] = (_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                     )(bVar82 | -((char)bVar18 < (char)bVar66) & bVar98 + 3 |
                                -(bVar66 == bVar18) & bVar98 + 2);
      p_Var1[0xf] = (_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                     )(bVar83 | -((char)bVar19 < (char)bVar67) & bVar99 + 3 |
                                -(bVar67 == bVar19) & bVar99 + 2);
      uVar41 = uVar41 + 0x10;
      ppuVar42 = ppuVar42 + 0x10;
    } while (uVar41 < uVar39);
  }
  if (uVar39 != uVar37) {
    do {
      if (strings[uVar39] == (uchar *)0x0) {
LAB_00222282:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x26,"unsigned char get_char(unsigned char *, size_t)");
      }
      bVar101 = strings[uVar39][depth];
      if (bVar101 < local_1b8[0]) {
        *(_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
          *)((long)__ptr._M_t + uVar39) =
             (_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
              )0x0;
      }
      else {
        _Var44 = (_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                  )0x2;
        uVar41 = 0;
        bVar48 = false;
        do {
          if (bVar101 == local_1b8[uVar41]) {
            _Var44 = (_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                      )((char)_Var44 + -1);
LAB_00222050:
            *(_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
              *)((long)__ptr._M_t + uVar39) = _Var44;
            if (!bVar48) goto LAB_0022206b;
            break;
          }
          if ((local_1b8[uVar41] < bVar101) && (bVar101 < local_1b8[uVar41 + 1])) goto LAB_00222050;
          bVar48 = 0xd < uVar41;
          uVar41 = uVar41 + 1;
          _Var44 = (_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                    )((char)_Var44 + '\x02');
        } while (uVar41 != 0xf);
        if (bVar101 == local_1b8[0xf]) {
          *(_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
            *)((long)__ptr._M_t + uVar39) =
               (_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                )0x1f;
        }
        else {
          *(_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
            *)((long)__ptr._M_t + uVar39) =
               (_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                )0x20;
        }
      }
LAB_0022206b:
      uVar39 = uVar39 + 1;
    } while (uVar39 < uVar37);
  }
  memset(&local_138,0,0x108);
  uVar41 = (ulong)(byte)*(_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                          *)__ptr._M_t;
  (&local_138)[uVar41]._M_t =
       (_Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
        *)&(((&local_138)[uVar41]._M_t)->_M_impl).field_0x1;
  uVar39 = 2;
  if (2 < uVar37) {
    uVar39 = uVar37;
  }
  bVar48 = true;
  uVar40 = 1;
  do {
    _Var44 = *(_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
               *)((long)__ptr._M_t + uVar40);
    if ((byte)_Var44 < (byte)SUB81(uVar41,0)) {
      bVar48 = false;
      break;
    }
    (&local_138)[(byte)_Var44]._M_t =
         (_Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
          *)&(((&local_138)[(byte)_Var44]._M_t)->_M_impl).field_0x1;
    uVar41 = (ulong)(byte)_Var44;
    uVar40 = uVar40 + 1;
  } while (uVar39 != uVar40);
  if (uVar40 < uVar37) {
    do {
      (&local_138)
      [(byte)*(_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
               *)((long)__ptr._M_t + uVar40)]._M_t =
           (_Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
            *)&(((&local_138)
                 [(byte)*(_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                          *)((long)__ptr._M_t + uVar40)]._M_t)->_M_impl).field_0x1;
      uVar40 = uVar40 + 1;
    } while (uVar37 != uVar40);
  }
  if (!bVar48) {
    __src = malloc(uVar37 * 8);
    multikey_multipivot<unsigned_char,_16U>::bucketindex._M_elems[0] = 0;
    lVar38 = 0;
    puVar43 = (undefined1 *)0x0;
    do {
      puVar43 = &(((&local_138)[lVar38]._M_t)->_M_impl).field_0x0 + (long)puVar43;
      multikey_multipivot<unsigned_char,_16U>::bucketindex._M_elems[lVar38 + 1] =
           (unsigned_long)puVar43;
      lVar38 = lVar38 + 1;
    } while (lVar38 != 0x20);
    lVar38 = 0;
    do {
      puVar2 = strings[lVar38];
      uVar3 = multikey_multipivot<unsigned_char,_16U>::bucketindex._M_elems
              [(byte)*(_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                       *)((long)__ptr._M_t + lVar38)];
      multikey_multipivot<unsigned_char,_16U>::bucketindex._M_elems
      [(byte)*(_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
               *)((long)__ptr._M_t + lVar38)] = uVar3 + 1;
      *(uchar **)((long)__src + uVar3 * 8) = puVar2;
      lVar38 = lVar38 + 1;
    } while (uVar37 + (uVar37 == 0) != lVar38);
    memcpy(strings,__src,uVar37 * 8);
    free(__src);
  }
  free(__ptr._M_t);
  _Var47._M_t = local_138._M_t;
  if ((_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
       *)local_138._M_t !=
      (_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
       *)0x0) {
    multikey_multipivot<unsigned_char,16u>(strings,(size_t)local_138._M_t,depth);
  }
  paVar46 = &local_128;
  lVar38 = 0;
  do {
    n_00 = *(size_t *)(paVar46 + -8);
    if ((n_00 != 0) && (local_1b8[lVar38] != 0)) {
      multikey_multipivot<unsigned_char,16u>(strings + (long)_Var47._M_t,n_00,depth + 1);
    }
    n_01 = *(size_t *)paVar46;
    if (n_01 != 0) {
      if (local_1b8[lVar38] == local_1b8[lVar38 + 1]) {
        __assert_fail("a != b",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_multipivot.cpp"
                      ,0x50,"unsigned int lcp(unsigned char, unsigned char)");
      }
      multikey_multipivot<unsigned_char,16u>(strings + (long)((long)_Var47._M_t + n_00),n_01,depth);
    }
    _Var47._M_t = (_Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
                   *)((_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                       *)((long)_Var47._M_t + n_00) + n_01);
    lVar38 = lVar38 + 1;
    paVar46 = paVar46 + 0x10;
  } while (lVar38 != 0xf);
  if (local_40 != 0) {
    if (local_1b8[0xf] != 0) {
      multikey_multipivot<unsigned_char,16u>(strings + (long)_Var47._M_t,local_40,depth + 1);
    }
    _Var47._M_t = (_Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
                   *)((long)_Var47._M_t + local_40);
  }
  if (local_38 != 0) {
    multikey_multipivot<unsigned_char,16u>(strings + (long)_Var47._M_t,local_38,depth);
  }
  if (local_1a0 != (void *)0x0) {
    operator_delete(local_1a0);
  }
  std::
  _Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
  ::~_Rb_tree(&local_188);
  return;
}

Assistant:

static void
multikey_multipivot(unsigned char** strings, size_t n, size_t depth)
{
	static_assert(Pivots > 0, "Pivots must be non-zero");
	static_assert(total_buckets(Pivots) < 0x100, "total number of bucket must be max 255");
	if (n < 15000) {
		mkqsort(strings, n, depth);
		return;
	}
	// TODO: collect frequencies to gain knowledge about distribution
	std::set<CharT> sample;
	for (unsigned i=0; i < Pivots; ++i) {
		double r=drand48();
		size_t pos = ((size_t)((n-7)*r));
		assert(pos+6 < n);
		std::array<CharT, 7> tmp;
		for (unsigned j=0;j<tmp.size();++j) {
			tmp[j] = get_char<CharT>(strings[pos+j], depth);
		}
		sample.insert(tmp.begin(), tmp.end());
	}
	// We _must_ select enough pivots -> insert junk.
	for (CharT i=1; sample.size() < Pivots; ++i) {
		if (is_end(i)) ++i;
		sample.insert(i);
	}
	// Pick pivots from the sample.
	std::vector<CharT> sample_array(sample.begin(), sample.end());
	sample.clear();
	std::array<CharT, Pivots> pivots;
	unsigned step = sample_array.size() / Pivots;
	assert(step > 0);
	for (unsigned i=0; i < Pivots; ++i) {
		pivots[i] = sample_array[step*i];
	}
	uint8_t* restrict oracle = static_cast<uint8_t*>(_mm_malloc(n, 16));
	fill_oracle<Pivots>(strings, n, oracle, pivots, depth);
	std::array<size_t, total_buckets(Pivots)> bucketsize;
	bucketsize.fill(0);
	uint8_t prev = oracle[0];
	bool sorted = true;
	size_t i=1;
	++bucketsize[prev];
	for (; i < n; ++i) {
		uint8_t bucket = oracle[i];
		if (prev > bucket) {
			sorted = false; break;
		}
		++bucketsize[bucket];
		prev = bucket;
	}
	for (; i < n; ++i)
		++bucketsize[oracle[i]];
	if (not sorted) {
		unsigned char** sorted = (unsigned char**)
			malloc(n*sizeof(unsigned char*));
		static std::array<size_t, total_buckets(Pivots)> bucketindex;
		bucketindex[0] = 0;
		for (unsigned i=1; i < total_buckets(Pivots); ++i)
			bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
		for (size_t i=0; i < n; ++i)
			sorted[bucketindex[oracle[i]]++] = strings[i];
		memcpy(strings, sorted, n*sizeof(unsigned char*));
		free(sorted);
	}
	_mm_free(oracle);
	size_t b=0;
	size_t bsum = bucketsize[0];
	if (bsum) multikey_multipivot<CharT, Pivots>(strings, bsum, depth);
	for (unsigned i=0; i < Pivots-1; ++i) {
		b = bucketsize[middle_bucket(i)];
		if (b and not is_end(pivots[i])) {
			multikey_multipivot<CharT, Pivots>(strings+bsum, b,
					depth+sizeof(CharT));
		}
		bsum += b;
		if ((b = bucketsize[right_bucket(i)])) {
			multikey_multipivot<CharT, Pivots>(strings+bsum, b,
				depth+lcp(pivots[i], pivots[i+1]));
		}
		bsum += b;
	}
	if ((b = bucketsize[middle_bucket(Pivots-1)])) {
		if (not is_end(pivots[Pivots-1]))
			multikey_multipivot<CharT, Pivots>(strings+bsum,
				b, depth+sizeof(CharT));
		bsum += b;
	}
	if ((b = bucketsize[right_bucket(Pivots-1)])) {
		multikey_multipivot<CharT, Pivots>(strings+bsum, b, depth);
	}
}